

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O0

void __thiscall Fade::~Fade(Fade *this)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  Engine *in_RDI;
  size_t i;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  ulong local_10;
  
  in_RDI->_vptr_Engine = (_func_int **)&PTR__Fade_001f0be8;
  pp_Var1 = in_RDI[6]._vptr_Engine;
  if (pp_Var1 != (_func_int **)0x0) {
    this_00 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(pp_Var1 + -1);
    for (pp_Var2 = pp_Var1 + (long)pp_Var1[-1] * 3; pp_Var1 != pp_Var2; pp_Var2 = pp_Var2 + -3) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(this_00);
    }
    operator_delete__(this_00);
  }
  for (local_10 = 0; local_10 < dfdb::params::NUM_OF_ATTRIBUTES; local_10 = local_10 + 1) {
    if (in_RDI[0x10]._vptr_Engine[local_10] != (_func_int *)0x0) {
      operator_delete__(in_RDI[0x10]._vptr_Engine[local_10]);
    }
  }
  if (in_RDI[0x10]._vptr_Engine != (_func_int **)0x0) {
    operator_delete__(in_RDI[0x10]._vptr_Engine);
  }
  std::
  unordered_map<std::vector<double,_std::allocator<double>_>,_fade::CacheAggregates,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_fade::CacheAggregates>_>_>
  ::~unordered_map((unordered_map<std::vector<double,_std::allocator<double>_>,_fade::CacheAggregates,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_fade::CacheAggregates>_>_>
                    *)0x1a079a);
  std::shared_ptr<DataHandler>::~shared_ptr((shared_ptr<DataHandler> *)0x1a07a8);
  std::shared_ptr<DTree>::~shared_ptr((shared_ptr<DTree> *)0x1a07b6);
  Engine::~Engine(in_RDI);
  return;
}

Assistant:

Fade::~Fade()
{
    delete[] _ids;

    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
        delete[] _aggregateRegister[i];
    delete[] _aggregateRegister;
}